

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_ReadVarint64_Test::TestBody
          (VarintCasesWithSizes_ReadVarint64_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  __tuple_element_t<0UL,_tuple<VarintCase,_int>_> *__src;
  __tuple_element_t<1UL,_tuple<VarintCase,_int>_> *p_Var3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_138;
  Message local_130;
  int64_t local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  AssertHelper local_d0;
  Message local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  uint64_t value;
  undefined1 local_90 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  int *kBlockSizes_case;
  VarintCase *kVarintCases_case;
  VarintCasesWithSizes_ReadVarint64_Test *this_local;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  __src = std::get<0ul,google::protobuf::io::(anonymous_namespace)::VarintCase,int>(pPVar2);
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  p_Var3 = std::get<1ul,google::protobuf::io::(anonymous_namespace)::VarintCase,int>(pPVar2);
  memcpy(&io::(anonymous_namespace)::CodedStreamTest::buffer_,__src,__src->size);
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*p_Var3);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_90,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  local_b9 = CodedInputStream::ReadVarint64
                       ((CodedInputStream *)local_90,(uint64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_b8,
               (AssertionResult *)"coded_input.ReadVarint64(&value)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xfd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_100,"kVarintCases_case.value","value",&__src->value,
             (unsigned_long *)&gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_90);
  local_128 = ArrayInputStream::ByteCount((ArrayInputStream *)&coded_input.extension_factory_);
  testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
            ((EqHelper *)local_120,"kVarintCases_case.size","input.ByteCount()",&__src->size,
             &local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x101,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, ReadVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadVarint64(&value));
    EXPECT_EQ(kVarintCases_case.value, value);
  }

  EXPECT_EQ(kVarintCases_case.size, input.ByteCount());
}